

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

base_learner * active_cover_setup(options_i *options,vw *all)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  byte bVar5;
  pointer paVar6;
  undefined8 uVar7;
  ulong uVar8;
  float *pfVar9;
  learner<active_cover,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<active_cover,_example> *l;
  size_t i;
  single_learner *base;
  stringstream __msg_1;
  stringstream __msg;
  bool active_cover_option;
  option_group_definition new_options;
  free_ptr<active_cover> data;
  string *in_stack_fffffffffffff468;
  vw *in_stack_fffffffffffff470;
  string *in_stack_fffffffffffff478;
  _func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<float> *in_stack_fffffffffffff480;
  string *in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff490;
  int plineNumber;
  learner<active_cover,_example> *this;
  char *in_stack_fffffffffffff498;
  vw_exception *in_stack_fffffffffffff4a0;
  typed_option<float> *in_stack_fffffffffffff4b8;
  option_group_definition *in_stack_fffffffffffff4c0;
  learner<active_cover,_example> *local_9f8;
  learner<char,_char> *in_stack_fffffffffffff630;
  stringstream local_9c0 [16];
  ostream local_9b0;
  allocator local_831;
  string local_830 [39];
  undefined1 local_809;
  stringstream local_7e8 [16];
  ostream local_7d8;
  allocator local_659;
  string local_658 [32];
  undefined4 local_638;
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [199];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<unsigned_long> local_4f8;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [199];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [199];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<bool> local_138;
  byte local_95;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff490 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<active_cover>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Active Learning with Cover",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_95 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"active_cover",&local_159);
  VW::config::make_option<bool>(in_stack_fffffffffffff478,(bool *)in_stack_fffffffffffff470);
  VW::config::typed_option<bool>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"enable active learning with cover",&local_181);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff4c0,(typed_option<bool> *)in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"mellowness",&local_249);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bd9bf);
  VW::config::make_option<float>(in_stack_fffffffffffff478,(float *)in_stack_fffffffffffff470);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff480,(float)((ulong)in_stack_fffffffffffff478 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,"active learning mellowness parameter c_0. Default 8.",&local_271);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"alpha",&local_339);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bdaa9);
  VW::config::make_option<float>(in_stack_fffffffffffff478,(float *)in_stack_fffffffffffff470);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff480,(float)((ulong)in_stack_fffffffffffff478 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_360,"active learning variance upper bound parameter alpha. Default 1.",&local_361
            );
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"beta_scale",&local_429);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bdb97);
  VW::config::make_option<float>(in_stack_fffffffffffff478,(float *)in_stack_fffffffffffff470);
  sqrtf(10.0);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff480,(float)((ulong)in_stack_fffffffffffff478 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_450,
             "active learning variance upper bound parameter beta_scale. Default sqrt(10).",
             &local_451);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"cover",&local_519);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bdc8a);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff478,(unsigned_long *)in_stack_fffffffffffff470);
  VW::config::typed_option<unsigned_long>::keep(&local_4f8,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff480,
             (unsigned_long)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"cover size. Default 12.",&local_541);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff4c0,(typed_option<unsigned_long> *)in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"oracular",&local_609);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bdd91);
  VW::config::make_option<bool>(in_stack_fffffffffffff478,(bool *)in_stack_fffffffffffff470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_630,"Use Oracular-CAL style query or not. Default false.",&local_631);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff4c0,(typed_option<bool> *)in_stack_fffffffffffff4b8);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff470);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_10)(local_10,local_60);
  if ((local_95 & 1) == 0) {
    local_8 = (vw *)0x0;
  }
  else {
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be4b3);
    paVar6->all = local_18;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be4cc);
    fVar1 = paVar6->beta_scale;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be4e7);
    paVar6->beta_scale = fVar1 * paVar6->beta_scale;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be507);
    if ((paVar6->oracular & 1U) != 0) {
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be51a);
      paVar6->cover_size = 0;
    }
    plVar4 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"lda",&local_659);
    bVar5 = (**(code **)(*plVar4 + 8))(plVar4,local_658);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_7e8);
      std::operator<<(&local_7d8,"error: you can\'t combine lda and active learning");
      local_809 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,plineNumber,
                 in_stack_fffffffffffff488);
      local_809 = 0;
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_830,"active",&local_831);
    bVar5 = (**(code **)(*local_10 + 8))(local_10,local_830);
    std::__cxx11::string::~string(local_830);
    std::allocator<char>::~allocator((allocator<char> *)&local_831);
    if ((bVar5 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_9c0);
      std::operator<<(&local_9b0,
                      "error: you can\'t use --active_cover and --active at the same time");
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,plineNumber,
                 in_stack_fffffffffffff488);
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    setup_base((options_i *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
    in_stack_fffffffffffff480 =
         (typed_option<float> *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffff630);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be925);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = paVar6->cover_size;
    uVar8 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar9 = (float *)operator_new__(uVar8);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be95d);
    paVar6->lambda_n = pfVar9;
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be970);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = paVar6->cover_size;
    uVar8 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pfVar9 = (float *)operator_new__(uVar8);
    paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be9a3);
    paVar6->lambda_d = pfVar9;
    local_9f8 = (learner<active_cover,_example> *)0x0;
    while( true ) {
      this = local_9f8;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be9d2);
      if ((learner<active_cover,_example> *)paVar6->cover_size <= this) break;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2be9ed);
      paVar6->lambda_n[(long)local_9f8] = 0.0;
      paVar6 = std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
                         ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bea0e);
      paVar6->lambda_d[(long)local_9f8] = 0.125;
      local_9f8 = local_9f8 + 1;
    }
    predict = (_func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    std::unique_ptr<active_cover,_void_(*)(void_*)>::operator->
              ((unique_ptr<active_cover,_void_(*)(void_*)> *)0x2bea5f);
    base_00 = LEARNER::init_learner<active_cover,example,LEARNER::learner<char,example>>
                        ((free_ptr<active_cover> *)this,
                         (learner<char,_example> *)in_stack_fffffffffffff488,
                         (_func_void_active_cover_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff480,predict,(size_t)in_stack_fffffffffffff470);
    LEARNER::learner<active_cover,_example>::set_finish(this,(_func_void_active_cover_ptr *)base_00)
    ;
    in_stack_fffffffffffff470 = (vw *)LEARNER::make_base<active_cover,example>(base_00);
    local_8 = in_stack_fffffffffffff470;
  }
  local_638 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff470);
  std::unique_ptr<active_cover,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<active_cover,_void_(*)(void_*)> *)in_stack_fffffffffffff480);
  return (base_learner *)local_8;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}